

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O0

UINT8 ym2203_read(void *chip,UINT8 a)

{
  undefined1 local_22;
  UINT8 ret;
  UINT8 addr;
  YM2203 *F2203;
  UINT8 a_local;
  void *chip_local;
  
  local_22 = '\0';
  if ((a & 1) == 0) {
    local_22 = *(UINT8 *)((long)chip + 0x12f);
  }
  else if (*(byte *)((long)chip + 300) < 0x10) {
    local_22 = (**(code **)((long)chip + 0x568))(*(undefined8 *)((long)chip + 0x578),0);
  }
  return local_22;
}

Assistant:

UINT8 ym2203_read(void *chip,UINT8 a)
{
	YM2203 *F2203 = (YM2203 *)chip;
	UINT8 addr = F2203->OPN.ST.address;
	UINT8 ret = 0;

	if( !(a&1) )
	{   /* status port */
		ret = FM_STATUS_FLAG(&F2203->OPN.ST);
	}
	else
	{   /* data port (only SSG) */
		if( addr < 16 ) ret = F2203->OPN.ST.SSG_funcs.read(F2203->OPN.ST.SSG_param, 0);
	}
	return ret;
}